

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PackedFieldHelper<9>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *param_1,FieldMetadata *md,ArrayOutput *param_3)

{
  LogMessage *pLVar1;
  LogFinisher local_65 [13];
  LogMessage local_58;
  ArrayOutput *local_20;
  ArrayOutput *param_2_local;
  FieldMetadata *md_local;
  void *param_0_local;
  
  local_20 = param_3;
  param_2_local = (ArrayOutput *)md;
  md_local = (FieldMetadata *)param_1;
  LogMessage::LogMessage
            (&local_58,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_util.cc"
             ,0x210);
  pLVar1 = LogMessage::operator<<(&local_58,"Not implemented field number ");
  pLVar1 = LogMessage::operator<<(pLVar1,*(uint *)((long)&param_2_local->ptr + 4));
  pLVar1 = LogMessage::operator<<(pLVar1," with type ");
  pLVar1 = LogMessage::operator<<(pLVar1,*(uint *)&param_2_local->field_0xc);
  LogFinisher::operator=(local_65,pLVar1);
  LogMessage::~LogMessage(&local_58);
  return;
}

Assistant:

static void Serialize(const void* /*field*/, const FieldMetadata& md,
                        O* /*output*/) {
    GOOGLE_LOG(FATAL) << "Not implemented field number " << md.tag << " with type "
               << md.type;
  }